

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

void deqp::gles31::bb::anon_unknown_11::copyNonWrittenData
               (BufferLayout *layout,BufferBlock *block,int instanceNdx,BlockDataPtr *srcBlockPtr,
               BlockDataPtr *dstBlockPtr,BufferVar *bufVar,SubTypeAccess *accessPath)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  StructType *this;
  BufferVar *var;
  const_reference dstEntry;
  BlockDataPtr *accessPath_00;
  int local_108;
  BufferVarLayoutEntry *varLayout;
  undefined1 local_f0 [4];
  int varNdx;
  string apiName;
  int local_a0;
  int memberNdx;
  int numMembers;
  int local_68;
  int elemNdx;
  int local_54;
  undefined1 local_50 [4];
  int arraySize;
  VarType curType;
  BufferVar *bufVar_local;
  BlockDataPtr *dstBlockPtr_local;
  BlockDataPtr *srcBlockPtr_local;
  int instanceNdx_local;
  BufferBlock *block_local;
  BufferLayout *layout_local;
  
  accessPath_00 = dstBlockPtr;
  curType.m_data._8_8_ = bufVar;
  glu::SubTypeAccess::getType((VarType *)local_50,accessPath);
  bVar2 = glu::VarType::isArrayType((VarType *)local_50);
  if (bVar2) {
    iVar3 = glu::VarType::getArraySize((VarType *)local_50);
    if (iVar3 == -1) {
      local_108 = BufferBlock::getLastUnsizedArraySize(block,instanceNdx);
    }
    else {
      local_108 = glu::VarType::getArraySize((VarType *)local_50);
    }
    local_54 = local_108;
    for (local_68 = 0; uVar1 = curType.m_data._8_8_, local_68 < local_54; local_68 = local_68 + 1) {
      glu::SubTypeAccess::element((SubTypeAccess *)&memberNdx,accessPath,local_68);
      copyNonWrittenData(layout,block,instanceNdx,srcBlockPtr,dstBlockPtr,(BufferVar *)uVar1,
                         (SubTypeAccess *)&memberNdx);
      glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)&memberNdx);
    }
  }
  else {
    bVar2 = glu::VarType::isStructType((VarType *)local_50);
    uVar1 = curType.m_data._8_8_;
    if (bVar2) {
      this = glu::VarType::getStructPtr((VarType *)local_50);
      iVar3 = glu::StructType::getNumMembers(this);
      for (local_a0 = 0; uVar1 = curType.m_data._8_8_, local_a0 < iVar3; local_a0 = local_a0 + 1) {
        glu::SubTypeAccess::member
                  ((SubTypeAccess *)((long)&apiName.field_2 + 8),accessPath,local_a0);
        copyNonWrittenData(layout,block,instanceNdx,srcBlockPtr,dstBlockPtr,(BufferVar *)uVar1,
                           (SubTypeAccess *)((long)&apiName.field_2 + 8));
        glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)((long)&apiName.field_2 + 8));
      }
    }
    else {
      var = (BufferVar *)glu::SubTypeAccess::getPath(accessPath);
      (anonymous_namespace)::getAPIName_abi_cxx11_
                ((string *)local_f0,(_anonymous_namespace_ *)block,(BufferBlock *)uVar1,var,
                 (TypeComponentVector *)accessPath_00);
      iVar3 = BufferLayout::getVariableIndex(layout,(string *)local_f0);
      dstEntry = std::
                 vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                 ::operator[](&layout->bufferVars,(long)iVar3);
      copyBufferVarData(dstEntry,dstBlockPtr,dstEntry,srcBlockPtr);
      std::__cxx11::string::~string((string *)local_f0);
    }
  }
  glu::VarType::~VarType((VarType *)local_50);
  return;
}

Assistant:

void copyNonWrittenData (
	const BufferLayout&			layout,
	const BufferBlock&			block,
	int							instanceNdx,
	const BlockDataPtr&			srcBlockPtr,
	const BlockDataPtr&			dstBlockPtr,
	const BufferVar&			bufVar,
	const glu::SubTypeAccess&	accessPath)
{
	const VarType curType = accessPath.getType();

	if (curType.isArrayType())
	{
		const int arraySize = curType.getArraySize() == VarType::UNSIZED_ARRAY ? block.getLastUnsizedArraySize(instanceNdx) : curType.getArraySize();

		for (int elemNdx = 0; elemNdx < arraySize; elemNdx++)
			copyNonWrittenData(layout, block, instanceNdx, srcBlockPtr, dstBlockPtr, bufVar, accessPath.element(elemNdx));
	}
	else if (curType.isStructType())
	{
		const int numMembers = curType.getStructPtr()->getNumMembers();

		for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
			copyNonWrittenData(layout, block, instanceNdx, srcBlockPtr, dstBlockPtr, bufVar, accessPath.member(memberNdx));
	}
	else
	{
		DE_ASSERT(curType.isBasicType());

		const string	apiName	= getAPIName(block, bufVar, accessPath.getPath());
		const int		varNdx	= layout.getVariableIndex(apiName);

		DE_ASSERT(varNdx >= 0);
		{
			const BufferVarLayoutEntry& varLayout = layout.bufferVars[varNdx];
			copyBufferVarData(varLayout, dstBlockPtr, varLayout, srcBlockPtr);
		}
	}
}